

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int urltype2driver(char *urltype,int *driver)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  fitsdriver *__s1;
  
  uVar3 = (ulong)(uint)no_of_drivers;
  __s1 = driverTable + uVar3;
  do {
    __s1 = __s1 + -1;
    if ((int)uVar3 < 1) {
      return 0x7c;
    }
    iVar1 = strcmp(__s1->prefix,urltype);
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
  } while (iVar1 != 0);
  *driver = uVar2;
  return 0;
}

Assistant:

int urltype2driver(char *urltype, int *driver)
/*
   compare input URL with list of known drivers, returning the
   matching driver numberL.
*/

{ 
    int ii;

       /* find matching driver; search most recent drivers first */

    for (ii=no_of_drivers - 1; ii >= 0; ii--)
    {
        if (0 == strcmp(driverTable[ii].prefix, urltype))
        { 
             *driver = ii;
             return(0);
        }
    }

    return(NO_MATCHING_DRIVER);   
}